

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O2

Event * __thiscall CurrentGenerator::update(CurrentGenerator *this,double n_dt)

{
  double dVar1;
  CurrentGenerator_param *pCVar2;
  CurrentEvent *this_00;
  double dVar3;
  double dVar4;
  result_type_conflict rVar5;
  
  pCVar2 = this->param;
  dVar4 = pCVar2->ac_hz;
  this_00 = (CurrentEvent *)operator_new(0x28);
  dVar1 = pCVar2->I;
  if (dVar4 <= 0.0) {
    rVar5 = std::normal_distribution<double>::operator()(&this->distribution,&this->generator);
    CurrentEvent::CurrentEvent(this_00,rVar5 * this->param->noiseOn + dVar1,1.0);
  }
  else {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar4 * 6.2831853071794 * dVar3);
    rVar5 = std::normal_distribution<double>::operator()(&this->distribution,&this->generator);
    CurrentEvent::CurrentEvent(this_00,rVar5 * this->param->noiseOn + dVar1 + dVar4,1.0);
  }
  return &this_00->super_Event;
}

Assistant:

Event* CurrentGenerator::update(double n_dt) {
    if(param->ac_hz > 0) {
        return new CurrentEvent(param->I + sin(2*3.1415926535897*param->ac_hz*clock->getCurrentTime()) + distribution(generator)*param->noiseOn, 1.0);
    }
    return new CurrentEvent(param->I + distribution(generator)*param->noiseOn, 1.0);
}